

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_flush_init_cmd(demo *demo)

{
  undefined1 local_70 [8];
  VkSubmitInfo submit_info;
  VkFence nullFence;
  VkCommandBuffer cmd_bufs [1];
  VkResult err;
  demo *demo_local;
  
  if (demo->setup_cmd != (VkCommandBuffer)0x0) {
    cmd_bufs[0]._4_4_ = (*glad_vkEndCommandBuffer)(demo->setup_cmd);
    if (cmd_bufs[0]._4_4_ != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,299,"void demo_flush_init_cmd(struct demo *)");
    }
    nullFence = (VkFence)demo->setup_cmd;
    submit_info.pSignalSemaphores = (VkSemaphore *)0x0;
    memset(local_70,0,0x48);
    local_70._0_4_ = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submit_info.pWaitDstStageMask._0_4_ = 1;
    submit_info._40_8_ = &nullFence;
    cmd_bufs[0]._4_4_ =
         (*glad_vkQueueSubmit)
                   (demo->queue,1,(VkSubmitInfo *)local_70,(VkFence)submit_info.pSignalSemaphores);
    if (cmd_bufs[0]._4_4_ != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x13a,"void demo_flush_init_cmd(struct demo *)");
    }
    cmd_bufs[0]._4_4_ = (*glad_vkQueueWaitIdle)(demo->queue);
    if (cmd_bufs[0]._4_4_ != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x13d,"void demo_flush_init_cmd(struct demo *)");
    }
    (*glad_vkFreeCommandBuffers)(demo->device,demo->cmd_pool,1,(VkCommandBuffer *)&nullFence);
    demo->setup_cmd = (VkCommandBuffer)0x0;
  }
  return;
}

Assistant:

static void demo_flush_init_cmd(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    if (demo->setup_cmd == VK_NULL_HANDLE)
        return;

    err = vkEndCommandBuffer(demo->setup_cmd);
    assert(!err);

    const VkCommandBuffer cmd_bufs[] = {demo->setup_cmd};
    VkFence nullFence = {VK_NULL_HANDLE};
    VkSubmitInfo submit_info = {.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
                                .pNext = NULL,
                                .waitSemaphoreCount = 0,
                                .pWaitSemaphores = NULL,
                                .pWaitDstStageMask = NULL,
                                .commandBufferCount = 1,
                                .pCommandBuffers = cmd_bufs,
                                .signalSemaphoreCount = 0,
                                .pSignalSemaphores = NULL};

    err = vkQueueSubmit(demo->queue, 1, &submit_info, nullFence);
    assert(!err);

    err = vkQueueWaitIdle(demo->queue);
    assert(!err);

    vkFreeCommandBuffers(demo->device, demo->cmd_pool, 1, cmd_bufs);
    demo->setup_cmd = VK_NULL_HANDLE;
}